

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsLoads.h
# Opt level: O2

ChShaftsTorsionSpringDamper * __thiscall
chrono::ChShaftsTorsionSpringDamper::Clone(ChShaftsTorsionSpringDamper *this)

{
  ChShaftsTorsionSpringDamper *this_00;
  
  this_00 = (ChShaftsTorsionSpringDamper *)::operator_new(0x88);
  ChShaftsTorsionSpringDamper(this_00,this);
  return this_00;
}

Assistant:

virtual ChShaftsTorsionSpringDamper* Clone() const override { return new ChShaftsTorsionSpringDamper(*this); }